

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

bool CheckProgram(GLuint handle,char *desc)

{
  PFNGLGETPROGRAMINFOLOGPROC p_Var1;
  FILE *__stream;
  char *pcVar2;
  undefined8 in_RSI;
  GLuint in_EDI;
  ImVector<char> buf;
  GLint log_length;
  GLint status;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  GLint GVar3;
  ImVector<char> local_28;
  GLint local_18;
  uint local_14;
  undefined8 local_10;
  GLuint local_4;
  
  local_14 = 0;
  local_18 = 0;
  local_10 = in_RSI;
  local_4 = in_EDI;
  (*__glewGetProgramiv)(in_EDI,0x8b82,(GLint *)&local_14);
  (*__glewGetProgramiv)(local_4,0x8b84,&local_18);
  if ((local_14 & 0xff) == 0) {
    fprintf(_stderr,
            "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to link %s! (with GLSL \'%s\')\n",
            local_10,g_GlslVersionString);
  }
  if (0 < local_18) {
    ImVector<char>::ImVector(&local_28);
    ImVector<char>::resize
              ((ImVector<char> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    p_Var1 = __glewGetProgramInfoLog;
    GVar3 = local_18;
    pcVar2 = ImVector<char>::begin(&local_28);
    (*p_Var1)(local_4,GVar3,(GLsizei *)0x0,pcVar2);
    __stream = _stderr;
    pcVar2 = ImVector<char>::begin(&local_28);
    fprintf(__stream,"%s\n",pcVar2);
    ImVector<char>::~ImVector((ImVector<char> *)CONCAT44(GVar3,local_4));
  }
  return (local_14 & 0xff) == 1;
}

Assistant:

static bool CheckProgram(GLuint handle, const char* desc)
{
    GLint status = 0, log_length = 0;
    glGetProgramiv(handle, GL_LINK_STATUS, &status);
    glGetProgramiv(handle, GL_INFO_LOG_LENGTH, &log_length);
    if ((GLboolean)status == GL_FALSE)
        fprintf(stderr, "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to link %s! (with GLSL '%s')\n", desc, g_GlslVersionString);
    if (log_length > 0)
    {
        ImVector<char> buf;
        buf.resize((int)(log_length + 1));
        glGetProgramInfoLog(handle, log_length, NULL, (GLchar*)buf.begin());
        fprintf(stderr, "%s\n", buf.begin());
    }
    return (GLboolean)status == GL_TRUE;
}